

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenUnionCreatorForString
          (PythonGenerator *this,EnumDef *enum_def,EnumVal *ev,string *code_ptr)

{
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_70 [8];
  string variant;
  string union_type;
  string *code;
  string *code_ptr_local;
  EnumVal *ev_local;
  EnumDef *enum_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Type_abi_cxx11_((string *)((long)&variant.field_2 + 8),&this->namer_,enum_def);
  IdlNamer::Variant_abi_cxx11_((string *)local_70,&this->namer_,ev);
  GenIndents_abi_cxx11_(&local_140,this,1);
  std::operator+(&local_120,&local_140,"if unionType == ");
  std::operator+(&local_100,&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&variant.field_2 + 8));
  std::operator+(&local_e0,&local_100,"().");
  std::operator+(&local_c0,&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_a0,&local_c0,":");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  GenIndents_abi_cxx11_(&local_180,this,2);
  std::operator+(&local_160,&local_180,"tab = Table(table.Bytes, table.Pos)");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  GenIndents_abi_cxx11_(&local_1c0,this,2);
  std::operator+(&local_1a0,&local_1c0,"union = tab.String(table.Pos)");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  GenIndents_abi_cxx11_(&local_200,this,2);
  std::operator+(&local_1e0,&local_200,"return union");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(variant.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenUnionCreatorForString(const EnumDef &enum_def, const EnumVal &ev,
                                std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto union_type = namer_.Type(enum_def);
    const auto variant = namer_.Variant(ev);

    code +=
        GenIndents(1) + "if unionType == " + union_type + "()." + variant + ":";
    code += GenIndents(2) + "tab = Table(table.Bytes, table.Pos)";
    code += GenIndents(2) + "union = tab.String(table.Pos)";
    code += GenIndents(2) + "return union";
  }